

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O1

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromId
          (UniqueId *__return_storage_ptr__,IFilePartLoader *this,ParserChar *colladaId,
          ClassId classId)

{
  size_type *psVar1;
  ObjectId OVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UniqueId *pUVar7;
  ulong uVar8;
  URI uri;
  String local_178;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  URI local_118;
  
  if ((colladaId == (ParserChar *)0x0) || (*colladaId == '\0')) {
    iVar4 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
    Loader::getUniqueId(__return_storage_ptr__,(Loader *)CONCAT44(extraout_var_00,iVar4),classId);
    return __return_storage_ptr__;
  }
  iVar4 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[0xb])(this);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"#","");
  local_138 = local_128;
  sVar5 = strlen(colladaId);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,colladaId,colladaId + sVar5);
  uVar8 = 0xf;
  if (local_158 != local_148) {
    uVar8 = local_148[0];
  }
  if (uVar8 < (ulong)(local_130 + local_150)) {
    uVar8 = 0xf;
    if (local_138 != local_128) {
      uVar8 = local_128[0];
    }
    if ((ulong)(local_130 + local_150) <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
      goto LAB_007ab475;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138);
LAB_007ab475:
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_178.field_2._M_allocated_capacity = *psVar1;
    local_178.field_2._8_8_ = puVar6[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *psVar1;
    local_178._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_178._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  COLLADABU::URI::URI(&local_118,(URI *)CONCAT44(extraout_var,iVar4),&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  iVar4 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
  pUVar7 = Loader::getUniqueId((Loader *)CONCAT44(extraout_var_01,iVar4),&local_118,classId);
  __return_storage_ptr__->mFileId = pUVar7->mFileId;
  uVar3 = *(undefined4 *)&pUVar7->field_0x4;
  OVar2 = pUVar7->mObjectId;
  __return_storage_ptr__->mClassId = pUVar7->mClassId;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar3;
  __return_storage_ptr__->mObjectId = OVar2;
  COLLADABU::URI::~URI(&local_118);
  return __return_storage_ptr__;
}

Assistant:

COLLADAFW::UniqueId IFilePartLoader::createUniqueIdFromId( const ParserChar* colladaId, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );

		if ( !colladaId || !(*colladaId) )
			return createUniqueId(classId);

		COLLADABU::URI uri(getFileUri(), String("#") + String((const char *)colladaId));

		COLLADAFW::UniqueId createdUniqueId = createUniqueIdFromUrl(uri, classId, true);
		return createdUniqueId;
	}